

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O1

void testStandardAttributes(string *tempDir)

{
  float *pfVar1;
  CubeMapFace CVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  short sVar6;
  _Alloc_hider name;
  V2f VVar7;
  undefined8 name_00;
  bool bVar8;
  short sVar9;
  unsigned_short uVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  ulong uVar14;
  Header *pHVar15;
  Chromaticities *pCVar16;
  Box2i *pBVar17;
  Rgba *pRVar18;
  half *phVar19;
  KeyCode *this;
  int iVar20;
  int x_4;
  int i;
  CubeMapFace CVar21;
  long lVar22;
  int x;
  CubeMapFace face_00;
  long lVar23;
  int i_3;
  int x_5;
  uif x_1;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar60;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  string filename;
  Chromaticities c;
  V2f pos;
  RgbaOutputFile out;
  CubeMapFace face;
  float fStack_474;
  Rational r9;
  Rand48 rand_1;
  undefined2 uStack_44a;
  M44f M2;
  Rand48 rand;
  undefined2 uStack_3f2;
  CubeMapFace face_2;
  float fStack_3cc;
  V2f pos_2;
  Vec3<float> local_3b8;
  V2f pif;
  Vec2<float> local_388;
  Vec2<float> local_380;
  float local_378 [2];
  undefined8 uStack_370;
  V2f local_368;
  char *local_360;
  M44f M1;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar51 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing optional standard attributes",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion from RGB to XYZ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  M1.x[0][0] = 0.64;
  M1.x[0][1] = 0.33;
  M2.x[0][0] = 0.3;
  M2.x[0][1] = 0.6;
  filename._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
  out._vptr_RgbaOutputFile = (_func_int **)0x3ea872b03ea01a37;
  Imf_2_5::Chromaticities::Chromaticities(&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&filename,(V2f *)&out);
  Imf_2_5::RGBtoXYZ(&M1,&c,100.0);
  fVar56 = M1.x[0][3] + M1.x[1][3] * 0.0 + M1.x[2][3] * 0.0 + M1.x[3][3];
  filename._M_string_length._0_4_ =
       (M1.x[0][2] + M1.x[1][2] * 0.0 + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar56;
  fVar32 = M1.x[1][0];
  fVar57 = M1.x[1][1];
  local_378[0] = M1.x[1][0];
  local_378[1] = M1.x[1][1];
  uStack_370 = 0;
  fVar47 = M1.x[0][0];
  fVar24 = M1.x[0][1];
  fVar26 = M1.x[2][0];
  fVar25 = M1.x[2][1];
  fVar60 = M1.x[3][0];
  auVar58._0_4_ = fVar47 + fVar32 * 0.0 + fVar26 * 0.0 + fVar60;
  fVar61 = M1.x[3][1];
  auVar58._4_4_ = fVar24 + fVar57 * 0.0 + fVar25 * 0.0 + fVar61;
  auVar58._8_8_ = 0;
  auVar59._4_4_ = fVar56;
  auVar59._0_4_ = fVar56;
  auVar59._8_8_ = 0;
  auVar59 = divps(auVar58,auVar59);
  filename._M_dataplus._M_p = auVar59._0_8_;
  fVar56 = M1.x[0][3] * 0.0 + M1.x[1][3] + M1.x[2][3] * 0.0 + M1.x[3][3];
  out._outputFile._0_4_ = (M1.x[0][2] * 0.0 + M1.x[1][2] + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar56;
  auVar53._0_4_ = fVar47 * 0.0 + fVar32 + fVar26 * 0.0 + fVar60;
  auVar53._4_4_ = fVar24 * 0.0 + fVar57 + fVar25 * 0.0 + fVar61;
  auVar53._8_8_ = 0;
  auVar4._4_4_ = fVar56;
  auVar4._0_4_ = fVar56;
  auVar4._8_8_ = 0;
  auVar59 = divps(auVar53,auVar4);
  out._vptr_RgbaOutputFile = auVar59._0_8_;
  auVar54._0_4_ = M1.x[0][3] * 0.0 + M1.x[1][3] * 0.0 + M1.x[2][3] + M1.x[3][3];
  fVar56 = (M1.x[0][2] * 0.0 + M1.x[1][2] * 0.0 + M1.x[2][2] + M1.x[3][2]) / auVar54._0_4_;
  auVar68._0_4_ = fVar47 * 0.0 + fVar32 * 0.0 + fVar26 + fVar60;
  auVar68._4_4_ = fVar24 * 0.0 + fVar57 * 0.0 + fVar25 + fVar61;
  auVar68._8_8_ = 0;
  auVar54._4_4_ = auVar54._0_4_;
  auVar54._8_8_ = 0;
  auVar59 = divps(auVar68,auVar54);
  r9 = auVar59._0_8_;
  auVar33._0_4_ = M1.x[0][3] + M1.x[1][3] + M1.x[2][3] + M1.x[3][3];
  auVar27._0_4_ = fVar47 + fVar32 + fVar26 + fVar60;
  auVar27._4_4_ = fVar24 + fVar57 + fVar25 + fVar61;
  auVar27._8_8_ = 0;
  fVar47 = (M1.x[0][2] + M1.x[1][2] + M1.x[2][2] + M1.x[3][2]) / auVar33._0_4_;
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_8_ = 0;
  auVar59 = divps(auVar27,auVar33);
  pos = auVar59._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   XYZ = ",0xc);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&filename);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green XYZ = ",0xc);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  XYZ = ",0xc);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&r9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white XYZ = ",0xc);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  auVar28._8_8_ = 0;
  auVar28._0_8_ = filename._M_dataplus._M_p;
  fVar25 = (float)((ulong)filename._M_dataplus._M_p >> 0x20);
  auVar34._4_4_ = fVar25;
  auVar34._0_4_ = fVar25;
  auVar34._8_4_ = fVar25;
  auVar34._12_4_ = fVar25;
  auVar35._4_12_ = auVar34._4_12_;
  auVar35._0_4_ = fVar25 + SUB84(filename._M_dataplus._M_p,0) + (float)filename._M_string_length;
  auVar37._0_8_ = auVar35._0_8_;
  auVar37._8_4_ = fVar25;
  auVar37._12_4_ = fVar25;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._4_4_ = auVar35._0_4_;
  auVar36._0_4_ = auVar35._0_4_;
  auVar59 = divps(auVar28,auVar36);
  _face = auVar59._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = out._vptr_RgbaOutputFile;
  fVar25 = (float)((ulong)out._vptr_RgbaOutputFile >> 0x20);
  auVar38._4_4_ = fVar25;
  auVar38._0_4_ = fVar25;
  auVar38._8_4_ = fVar25;
  auVar38._12_4_ = fVar25;
  auVar39._4_12_ = auVar38._4_12_;
  auVar39._0_4_ = fVar25 + SUB84(out._vptr_RgbaOutputFile,0) + out._outputFile._0_4_;
  auVar41._0_8_ = auVar39._0_8_;
  auVar41._8_4_ = fVar25;
  auVar41._12_4_ = fVar25;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40._4_4_ = auVar39._0_4_;
  auVar40._0_4_ = auVar39._0_4_;
  auVar59 = divps(auVar29,auVar40);
  _face_2 = auVar59._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_4_ = r9.n;
  auVar30._4_4_ = r9.d;
  fVar25 = (float)r9.d;
  auVar42._4_4_ = fVar25;
  auVar42._0_4_ = fVar25;
  auVar42._8_4_ = fVar25;
  auVar42._12_4_ = fVar25;
  auVar43._4_12_ = auVar42._4_12_;
  auVar43._0_4_ = fVar25 + (float)r9.n + fVar56;
  auVar45._0_8_ = auVar43._0_8_;
  auVar45._8_4_ = fVar25;
  auVar45._12_4_ = fVar25;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._4_4_ = auVar43._0_4_;
  auVar44._0_4_ = auVar43._0_4_;
  auVar59 = divps(auVar30,auVar44);
  auVar46._8_8_ = 0;
  auVar46._0_4_ = pos.x;
  auVar46._4_4_ = pos.y;
  fVar25 = pos.y;
  auVar48._4_4_ = fVar25;
  auVar48._0_4_ = fVar25;
  auVar48._8_4_ = fVar25;
  auVar48._12_4_ = fVar25;
  auVar49._4_12_ = auVar48._4_12_;
  auVar49._0_4_ = fVar25 + pos.x + fVar47;
  local_380 = auVar59._0_8_;
  auVar51._0_8_ = auVar49._0_8_;
  auVar51._8_4_ = fVar25;
  auVar51._12_4_ = fVar25;
  auVar50._8_8_ = auVar51._8_8_;
  auVar50._4_4_ = auVar49._0_4_;
  auVar50._0_4_ = auVar49._0_4_;
  auVar59 = divps(auVar46,auVar50);
  local_388 = auVar59._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   xy = ",0xb);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)&face);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green xy = ",0xb);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)&face_2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  xy = ",0xb);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,&local_380);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white xy = ",0xb);
  poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,&local_388);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  fVar25 = pos.y;
  if (pos.y <= -pos.y) {
    fVar25 = -pos.y;
  }
  if (fVar25 * 1e-05 <
      (float)(-(uint)(100.0 < pos.y) & (uint)(pos.y + -100.0) |
             ~-(uint)(100.0 < pos.y) & (uint)(100.0 - pos.y))) {
    __assert_fail("equalWithRelError (W1.y, Y, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x55,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  if ((float)(~-(uint)(c.red.x < (float)face) & (uint)(c.red.x - (float)face) |
             (uint)((float)face - c.red.x) & -(uint)(c.red.x < (float)face)) <= 1e-05) {
    if ((float)(~-(uint)(c.red.y < fStack_474) & (uint)(c.red.y - fStack_474) |
               (uint)(fStack_474 - c.red.y) & -(uint)(c.red.y < fStack_474)) <= 1e-05) {
      if ((1e-05 < (float)(~-(uint)(c.green.x < (float)face_2) & (uint)(c.green.x - (float)face_2) |
                          (uint)((float)face_2 - c.green.x) & -(uint)(c.green.x < (float)face_2)))
         || (1e-05 < (float)(~-(uint)(c.green.y < fStack_3cc) & (uint)(c.green.y - fStack_3cc) |
                            (uint)(fStack_3cc - c.green.y) & -(uint)(c.green.y < fStack_3cc)))) {
        __assert_fail("g1.equalWithAbsError (c.green, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                      ,0x57,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      if ((1e-05 < (float)(~-(uint)(c.blue.x < local_380.x) & (uint)(c.blue.x - local_380.x) |
                          (uint)(local_380.x - c.blue.x) & -(uint)(c.blue.x < local_380.x))) ||
         (1e-05 < (float)(~-(uint)(c.blue.y < local_380.y) & (uint)(c.blue.y - local_380.y) |
                         (uint)(local_380.y - c.blue.y) & -(uint)(c.blue.y < local_380.y)))) {
        __assert_fail("b1.equalWithAbsError (c.blue, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                      ,0x58,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      if ((1e-05 < (float)(~-(uint)(c.white.x < local_388.x) & (uint)(c.white.x - local_388.x) |
                          (uint)(local_388.x - c.white.x) & -(uint)(c.white.x < local_388.x))) ||
         (1e-05 < (float)(~-(uint)(c.white.y < local_388.y) & (uint)(c.white.y - local_388.y) |
                         (uint)(local_388.y - c.white.y) & -(uint)(c.white.y < local_388.y)))) {
        __assert_fail("w1.equalWithAbsError (c.white, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                      ,0x59,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"conversion from XYZ to RGB",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      Imf_2_5::XYZtoRGB(&M2,&c,100.0);
      auVar66._0_4_ =
           (float)filename._M_string_length * M2.x[2][3] +
           filename._M_dataplus._M_p._0_4_ * M2.x[0][3] +
           filename._M_dataplus._M_p._4_4_ * M2.x[1][3] + M2.x[3][3];
      local_378[0] = M2.x[0][0];
      local_378[1] = M2.x[0][1];
      uStack_370 = 0;
      fVar57 = M2.x[1][0];
      fVar60 = M2.x[1][1];
      fVar25 = M2.x[0][0];
      fVar26 = M2.x[0][1];
      fVar24 = M2.x[2][0];
      fVar32 = M2.x[2][1];
      fVar61 = M2.x[3][0];
      auVar63._0_4_ =
           (float)filename._M_string_length * fVar24 +
           filename._M_dataplus._M_p._0_4_ * fVar25 + filename._M_dataplus._M_p._4_4_ * fVar57 +
           fVar61;
      fVar62 = M2.x[3][1];
      auVar63._4_4_ =
           (float)filename._M_string_length * fVar32 +
           filename._M_dataplus._M_p._0_4_ * fVar26 + filename._M_dataplus._M_p._4_4_ * fVar60 +
           fVar62;
      auVar63._8_4_ =
           filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0
      ;
      auVar63._12_4_ =
           filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0
      ;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_8_ = 0;
      auVar59 = divps(auVar63,auVar66);
      _rand = auVar59._0_8_;
      auVar64._0_4_ =
           out._outputFile._0_4_ * M2.x[2][3] +
           out._vptr_RgbaOutputFile._0_4_ * M2.x[0][3] + M2.x[1][3] * out._vptr_RgbaOutputFile._4_4_
           + M2.x[3][3];
      auVar67._0_4_ =
           out._outputFile._0_4_ * fVar24 +
           out._vptr_RgbaOutputFile._0_4_ * fVar25 + out._vptr_RgbaOutputFile._4_4_ * fVar57 +
           fVar61;
      auVar67._4_4_ =
           out._outputFile._0_4_ * fVar32 +
           out._vptr_RgbaOutputFile._0_4_ * fVar26 + out._vptr_RgbaOutputFile._4_4_ * fVar60 +
           fVar62;
      auVar67._8_4_ =
           out._vptr_RgbaOutputFile._0_4_ * 0.0 + out._vptr_RgbaOutputFile._4_4_ * 0.0 + 0.0 + 0.0;
      auVar67._12_4_ =
           out._vptr_RgbaOutputFile._0_4_ * 0.0 + out._vptr_RgbaOutputFile._4_4_ * 0.0 + 0.0 + 0.0;
      auVar64._4_4_ = auVar64._0_4_;
      auVar64._8_8_ = 0;
      auVar59 = divps(auVar67,auVar64);
      pif = auVar59._0_8_;
      auVar31._0_4_ =
           fVar56 * M2.x[2][3] + (float)r9.n * M2.x[0][3] + M2.x[1][3] * (float)r9.d + M2.x[3][3];
      auVar65._0_4_ = fVar56 * fVar24 + (float)r9.n * fVar25 + (float)r9.d * fVar57 + fVar61;
      auVar65._4_4_ = fVar56 * fVar32 + (float)r9.n * fVar26 + (float)r9.d * fVar60 + fVar62;
      auVar65._8_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
      auVar65._12_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_8_ = 0;
      auVar59 = divps(auVar65,auVar31);
      pos_2 = auVar59._0_8_;
      auVar52._0_4_ = M2.x[2][3] * fVar47 + M2.x[0][3] * pos.x + M2.x[1][3] * pos.y + M2.x[3][3];
      auVar55._0_4_ = fVar47 * fVar24 + pos.x * fVar25 + pos.y * fVar57 + fVar61;
      auVar55._4_4_ = fVar47 * fVar32 + pos.x * fVar26 + pos.y * fVar60 + fVar62;
      auVar55._8_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
      auVar55._12_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
      local_3b8.z = (M2.x[2][2] * fVar47 + M2.x[0][2] * pos.x + M2.x[1][2] * pos.y + M2.x[3][2]) /
                    auVar52._0_4_;
      auVar52._4_4_ = auVar52._0_4_;
      auVar52._8_8_ = 0;
      auVar59 = divps(auVar55,auVar52);
      local_3b8._0_8_ = auVar59._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   RGB = ",0xc);
      poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&rand);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green RGB = ",0xc);
      poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pif);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  RGB = ",0xc);
      poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos_2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white RGB = ",0xc);
      poVar13 = Imath_2_5::operator<<((ostream *)&std::cout,&local_3b8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      _rand_1 = 0x3f800000;
      if ((float)(-(uint)(1.0 < (float)rand._state._0_4_) & (uint)((float)rand._state._0_4_ + -1.0)
                 | ~-(uint)(1.0 < (float)rand._state._0_4_) & (uint)(1.0 - (float)rand._state._0_4_)
                 ) <= 0.001) {
        lVar22 = 1;
        do {
          lVar23 = lVar22;
          if (lVar23 == 3) {
            uVar14 = 2;
            goto LAB_001907bd;
          }
          fVar25 = *(float *)(rand._state + lVar23 * 2);
          fVar47 = *(float *)(rand_1._state + lVar23 * 2);
          lVar22 = lVar23 + 1;
        } while ((float)(~-(uint)(fVar47 < fVar25) & (uint)(fVar47 - fVar25) |
                        (uint)(fVar25 - fVar47) & -(uint)(fVar47 < fVar25)) <= 0.001);
        uVar14 = lVar23 - 1;
LAB_001907bd:
        if (1 < uVar14) {
          _rand_1 = 0x3f80000000000000;
          if (ABS(pif.x) <= 0.001) {
            lVar22 = 1;
            do {
              lVar23 = lVar22;
              if (lVar23 == 3) {
                uVar14 = 2;
                goto LAB_00190848;
              }
              fVar25 = (&pif.x)[lVar23];
              fVar47 = *(float *)(rand_1._state + lVar23 * 2);
              lVar22 = lVar23 + 1;
            } while ((float)(~-(uint)(fVar47 < fVar25) & (uint)(fVar47 - fVar25) |
                            (uint)(fVar25 - fVar47) & -(uint)(fVar47 < fVar25)) <= 0.001);
            uVar14 = lVar23 - 1;
LAB_00190848:
            if (1 < uVar14) {
              _rand_1 = 0;
              if (ABS(pos_2.x) <= 0.001) {
                lVar22 = 1;
                do {
                  lVar23 = lVar22;
                  if (lVar23 == 3) {
                    uVar14 = 2;
                    goto LAB_001908ce;
                  }
                  fVar25 = (&pos_2.x)[lVar23];
                  fVar47 = *(float *)(rand_1._state + lVar23 * 2);
                  lVar22 = lVar23 + 1;
                } while ((float)(~-(uint)(fVar47 < fVar25) & (uint)(fVar47 - fVar25) |
                                (uint)(fVar25 - fVar47) & -(uint)(fVar47 < fVar25)) <= 0.001);
                uVar14 = lVar23 - 1;
LAB_001908ce:
                if (1 < uVar14) {
                  _rand_1 = 0x3f8000003f800000;
                  if ((float)(-(uint)(1.0 < local_3b8.x) & (uint)(local_3b8.x + -1.0) |
                             ~-(uint)(1.0 < local_3b8.x) & (uint)(1.0 - local_3b8.x)) <= 0.001) {
                    lVar22 = 1;
                    do {
                      lVar23 = lVar22;
                      if (lVar23 == 3) {
                        uVar14 = 2;
                        goto LAB_00190976;
                      }
                      fVar25 = (&local_3b8.x)[lVar23];
                      fVar47 = *(float *)(rand_1._state + lVar23 * 2);
                      lVar22 = lVar23 + 1;
                    } while ((float)(~-(uint)(fVar47 < fVar25) & (uint)(fVar47 - fVar25) |
                                    (uint)(fVar25 - fVar47) & -(uint)(fVar47 < fVar25)) <= 0.001);
                    uVar14 = lVar23 - 1;
LAB_00190976:
                    if (1 < uVar14) {
                      pcVar3 = (tempDir->_M_dataplus)._M_p;
                      filename._M_dataplus._M_p = (pointer)&filename.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&filename,pcVar3,pcVar3 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&filename);
                      name = filename._M_dataplus;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"chromaticities attribute",0x18);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
                      std::ostream::put('x');
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"writing, ",9);
                      M1.x[0][0] = 1.0;
                      M1.x[0][1] = 2.0;
                      M2.x[0][0] = 3.0;
                      M2.x[0][1] = 4.0;
                      out._vptr_RgbaOutputFile = (_func_int **)0x40c0000040a00000;
                      r9.n = 0x40e00000;
                      r9.d = 0x41000000;
                      Imf_2_5::Chromaticities::Chromaticities
                                (&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&out,(V2f *)&r9);
                      M1.x[0][0] = 0.0;
                      M1.x[0][1] = 0.0;
                      Imf_2_5::Header::Header
                                ((Header *)&M2,100,100,1.0,(V2f *)&M1,1.0,INCREASING_Y,
                                 ZIP_COMPRESSION);
                      bVar8 = Imf_2_5::hasChromaticities((Header *)&M2);
                      if (bVar8) {
                        __assert_fail("hasChromaticities (header) == false",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x7c,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      Imf_2_5::addChromaticities((Header *)&M2,&c);
                      bVar8 = Imf_2_5::hasChromaticities((Header *)&M2);
                      if (!bVar8) {
                        __assert_fail("hasChromaticities (header) == true",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x7f,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      iVar11 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                (&out,name._M_p,(Header *)&M2,WRITE_RGBA,iVar11);
                      sVar6 = _DAT_0044213e;
                      lVar22 = 0;
                      do {
                        sVar9 = sVar6;
                        if (sVar6 == 0) {
                          sVar9 = half::convert(0x3f800000);
                        }
                        *(short *)(M1.x[0] + lVar22 * 2) = sVar9;
                        sVar9 = sVar6;
                        if (sVar6 == 0) {
                          sVar9 = half::convert(0x3f800000);
                        }
                        *(short *)((long)M1.x[0] + lVar22 * 8 + 2) = sVar9;
                        sVar9 = sVar6;
                        if (sVar6 == 0) {
                          sVar9 = half::convert(0x3f800000);
                        }
                        *(short *)(M1.x[0] + lVar22 * 2 + 1) = sVar9;
                        sVar9 = sVar6;
                        if (sVar6 == 0) {
                          sVar9 = half::convert(0x3f800000);
                        }
                        *(short *)((long)M1.x[0] + lVar22 * 8 + 6) = sVar9;
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 100);
                      Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,(Rgba *)&M1,1,0);
                      Imf_2_5::RgbaOutputFile::writePixels(&out,100);
                      Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"reading, comparing",0x12);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
                      std::ostream::put('x');
                      std::ostream::flush();
                      iVar11 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&M1,name._M_p,iVar11);
                      pHVar15 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                      pCVar16 = Imf_2_5::chromaticities(pHVar15);
                      pHVar15 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                      bVar8 = Imf_2_5::hasChromaticities(pHVar15);
                      if (!bVar8) {
                        __assert_fail("hasChromaticities (in.header()) == true",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x97,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      if ((c.red.x == (pCVar16->red).x) && (!NAN(c.red.x) && !NAN((pCVar16->red).x))
                         ) {
                        pfVar1 = &(pCVar16->red).y;
                        if ((c.red.y == *pfVar1) && (!NAN(c.red.y) && !NAN(*pfVar1))) {
                          if ((((c.green.x != (pCVar16->green).x) ||
                               (NAN(c.green.x) || NAN((pCVar16->green).x))) ||
                              (pfVar1 = &(pCVar16->green).y, c.green.y != *pfVar1)) ||
                             (NAN(c.green.y) || NAN(*pfVar1))) {
                            __assert_fail("c1.green == c2.green",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x99,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          if (((c.blue.x != (pCVar16->blue).x) ||
                              (NAN(c.blue.x) || NAN((pCVar16->blue).x))) ||
                             ((pfVar1 = &(pCVar16->blue).y, c.blue.y != *pfVar1 ||
                              (NAN(c.blue.y) || NAN(*pfVar1))))) {
                            __assert_fail("c1.blue == c2.blue",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x9a,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          if (((c.white.x != (pCVar16->white).x) ||
                              (NAN(c.white.x) || NAN((pCVar16->white).x))) ||
                             ((pfVar1 = &(pCVar16->white).y, c.white.y != *pfVar1 ||
                              (NAN(c.white.y) || NAN(*pfVar1))))) {
                            __assert_fail("c1.white == c2.white",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x9b,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                          remove(name._M_p);
                          Imf_2_5::Header::~Header((Header *)&M2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)filename._M_dataplus._M_p != &filename.field_2) {
                            operator_delete(filename._M_dataplus._M_p,
                                            filename.field_2._M_allocated_capacity + 1);
                          }
                          M2.x[0]._0_8_ = M2.x + 1;
                          pcVar3 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&M2,pcVar3,pcVar3 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&M2);
                          c.red = (V2f)&c.blue;
                          pcVar3 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&c,pcVar3,pcVar3 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&c);
                          name_00 = M2.x[0]._0_8_;
                          VVar7 = c.red;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"latitude-longitude environment map",0x22
                                    );
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
                          std::ostream::put('x');
                          std::ostream::flush();
                          filename._M_dataplus._M_p = (pointer)0x0;
                          Imf_2_5::Header::Header
                                    ((Header *)&M1,0x168,0xb4,1.0,(V2f *)&filename,1.0,INCREASING_Y,
                                     ZIP_COMPRESSION);
                          filename._M_dataplus._M_p = filename._M_dataplus._M_p & 0xffffffff00000000
                          ;
                          Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&filename);
                          filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                          if (1e-06 < (float)(-(uint)(1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                              (uint)(out._vptr_RgbaOutputFile._0_4_ + -1.5707964) |
                                             ~-(uint)(1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                             (uint)(1.5707964 - out._vptr_RgbaOutputFile._0_4_))) {
                            __assert_fail("equalWithAbsError (pos.x, float (M_PI/2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0xaf,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                          if (1e-06 < (float)(-(uint)(-1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                              (uint)(out._vptr_RgbaOutputFile._0_4_ + 1.5707964) |
                                             ~-(uint)(-1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                             (uint)(-1.5707964 - out._vptr_RgbaOutputFile._0_4_))) {
                            __assert_fail("equalWithAbsError (pos.x, float (-M_PI/2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0xb2,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x0;
                          filename._M_string_length._0_4_ = 1.0;
                          Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                          if (ABS(out._vptr_RgbaOutputFile._0_4_) <= 1e-06) {
                            bVar8 = false;
                            do {
                              bVar5 = bVar8;
                              if (bVar5) break;
                              bVar8 = true;
                            } while (ABS(out._vptr_RgbaOutputFile._4_4_) <= 1e-06);
                            if (bVar5) {
                              filename._M_dataplus._M_p = (pointer)0x3f800000;
                              filename._M_string_length._0_4_ = 0.0;
                              Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                              if ((1e-06 < ABS(out._vptr_RgbaOutputFile._0_4_)) ||
                                 (1e-06 < (float)(-(uint)(1.5707964 < out._vptr_RgbaOutputFile._4_4_
                                                         ) &
                                                  (uint)(out._vptr_RgbaOutputFile._4_4_ + -1.5707964
                                                        ) |
                                                 ~-(uint)(1.5707964 < out._vptr_RgbaOutputFile._4_4_
                                                         ) &
                                                 (uint)(1.5707964 - out._vptr_RgbaOutputFile._4_4_))
                                 )) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, M_PI/2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                              ,0xb8,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              filename._M_dataplus._M_p = (pointer)0xbf800000;
                              filename._M_string_length._0_4_ = 0.0;
                              Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                              if ((1e-06 < ABS(out._vptr_RgbaOutputFile._0_4_)) ||
                                 (1e-06 < (float)(-(uint)(-1.5707964 <
                                                         out._vptr_RgbaOutputFile._4_4_) &
                                                  (uint)(out._vptr_RgbaOutputFile._4_4_ + 1.5707964)
                                                 | ~-(uint)(-1.5707964 <
                                                           out._vptr_RgbaOutputFile._4_4_) &
                                                   (uint)(-1.5707964 -
                                                         out._vptr_RgbaOutputFile._4_4_)))) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, -M_PI/2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                              ,0xbb,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                              filename._M_string_length._0_4_ = 1.0;
                              Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                              if ((float)(-(uint)(0.7853982 < out._vptr_RgbaOutputFile._0_4_) &
                                          (uint)(out._vptr_RgbaOutputFile._0_4_ + -0.7853982) |
                                         ~-(uint)(0.7853982 < out._vptr_RgbaOutputFile._0_4_) &
                                         (uint)(0.7853982 - out._vptr_RgbaOutputFile._0_4_)) <=
                                  1e-06) {
                                bVar8 = false;
                                do {
                                  bVar5 = bVar8;
                                  if (bVar5) break;
                                  bVar8 = true;
                                } while (ABS(out._vptr_RgbaOutputFile._4_4_) <= 1e-06);
                                if (bVar5) {
                                  filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                                  filename._M_string_length._0_4_ = 1.0;
                                  Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                                  if ((float)(-(uint)(-0.7853982 < out._vptr_RgbaOutputFile._0_4_) &
                                              (uint)(out._vptr_RgbaOutputFile._0_4_ + 0.7853982) |
                                             ~-(uint)(-0.7853982 < out._vptr_RgbaOutputFile._0_4_) &
                                             (uint)(-0.7853982 - out._vptr_RgbaOutputFile._0_4_)) <=
                                      1e-06) {
                                    bVar8 = false;
                                    do {
                                      bVar5 = bVar8;
                                      if (bVar5) break;
                                      bVar8 = true;
                                    } while (ABS(out._vptr_RgbaOutputFile._4_4_) <= 1e-06);
                                    if (bVar5) {
                                      pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                      out._vptr_RgbaOutputFile = (_func_int **)0x40490fdb3fc90fdb;
                                      Imf_2_5::LatLongMap::pixelPosition(pBVar17,(V2f *)&out);
                                      if (ABS(filename._M_dataplus._M_p._0_4_) <= 0.00036) {
                                        bVar8 = false;
                                        do {
                                          bVar5 = bVar8;
                                          if (bVar5) break;
                                          bVar8 = true;
                                        } while (ABS(filename._M_dataplus._M_p._4_4_) <= 0.00036);
                                        if (bVar5) {
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          out._vptr_RgbaOutputFile =
                                               (_func_int **)0xc0490fdbbfc90fdb;
                                          Imf_2_5::LatLongMap::pixelPosition(pBVar17,(V2f *)&out);
                                          fVar25 = filename._M_dataplus._M_p._0_4_;
                                          fVar47 = filename._M_dataplus._M_p._4_4_;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          fVar24 = (float)(pBVar17->max).x;
                                          if ((0.00036 < (float)(~-(uint)(fVar24 < fVar25) &
                                                                 (uint)(fVar24 - fVar25) |
                                                                (uint)(fVar25 - fVar24) &
                                                                -(uint)(fVar24 < fVar25))) ||
                                             (fVar25 = (float)(pBVar17->max).y,
                                             0.00036 < (float)(~-(uint)(fVar25 < fVar47) &
                                                               (uint)(fVar25 - fVar47) |
                                                              (uint)(fVar47 - fVar25) &
                                                              -(uint)(fVar25 < fVar47)))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f (header.dataWindow().max), 1e-6f * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,199,
                                                  "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                                  );
                                          }
                                          pRVar18 = (Rgba *)operator_new__(0x7e900);
                                          phVar19 = &pRVar18->b;
                                          lVar22 = 0;
                                          do {
                                            lVar23 = 0;
                                            do {
                                              pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                              out._vptr_RgbaOutputFile =
                                                   (_func_int **)
                                                   CONCAT44((float)(int)lVar22,(float)(int)lVar23);
                                              Imf_2_5::LatLongMap::direction
                                                        ((LatLongMap *)&filename,pBVar17,(V2f *)&out
                                                        );
                                              fVar25 = filename._M_dataplus._M_p._0_4_ + 1.0;
                                              if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                                sVar9 = *(short *)((long)&half::_eLut +
                                                                  (ulong)((uint)fVar25 >> 0x17) * 2)
                                                ;
                                                if (sVar9 == 0) {
                                                  uVar10 = half::convert((int)fVar25);
                                                }
                                                else {
                                                  uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff)
                                                                           + 0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                                }
                                              }
                                              else {
                                                uVar10 = 0;
                                              }
                                              phVar19[lVar23 * 4 + -2]._h = uVar10;
                                              fVar25 = filename._M_dataplus._M_p._4_4_ + 1.0;
                                              if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                                sVar9 = *(short *)((long)&half::_eLut +
                                                                  (ulong)((uint)fVar25 >> 0x17) * 2)
                                                ;
                                                if (sVar9 == 0) {
                                                  uVar10 = half::convert((int)fVar25);
                                                }
                                                else {
                                                  uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff)
                                                                           + 0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                                }
                                              }
                                              else {
                                                uVar10 = 0;
                                              }
                                              phVar19[lVar23 * 4 + -1]._h = uVar10;
                                              fVar25 = (float)filename._M_string_length + 1.0;
                                              if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                                sVar9 = *(short *)((long)&half::_eLut +
                                                                  (ulong)((uint)fVar25 >> 0x17) * 2)
                                                ;
                                                if (sVar9 == 0) {
                                                  uVar10 = half::convert((int)fVar25);
                                                }
                                                else {
                                                  uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff)
                                                                           + 0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                                }
                                              }
                                              else {
                                                uVar10 = 0;
                                              }
                                              phVar19[lVar23 * 4]._h = uVar10;
                                              lVar23 = lVar23 + 1;
                                            } while (lVar23 != 0x168);
                                            lVar22 = lVar22 + 1;
                                            phVar19 = phVar19 + 0x5a0;
                                          } while (lVar22 != 0xb4);
                                          iVar11 = Imf_2_5::globalThreadCount();
                                          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename,(char *)name_00,
                                                     (Header *)&M1,WRITE_RGB,iVar11);
                                          Imf_2_5::RgbaOutputFile::setFrameBuffer
                                                    ((RgbaOutputFile *)&filename,pRVar18,1,0x168);
                                          Imf_2_5::RgbaOutputFile::writePixels
                                                    ((RgbaOutputFile *)&filename,0xb4);
                                          Imf_2_5::RgbaOutputFile::~RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename);
                                          rand._state[0] = 0x5a5a;
                                          rand._state[1] = 0x5a5a;
                                          rand._state[2] = 0x5a5a;
                                          iVar11 = 0;
                                          do {
                                            Imath_2_5::
                                            hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                                      ((Imath_2_5 *)&filename,&rand);
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            Imf_2_5::LatLongMap::pixelPosition
                                                      ((LatLongMap *)&pos,pBVar17,(V3f *)&filename);
                                            fVar24 = pos.y;
                                            fVar47 = pos.x;
                                            fVar25 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            iVar20 = (int)(fVar24 + 0.5);
                                            lVar22 = (long)(int)(fVar47 + 0.5);
                                            fVar25 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                                            pRVar18[(long)iVar20 * 0x168 + lVar22].r._h = uVar10;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            fVar25 = ((float)filename._M_string_length + 1.0) * 0.8;
                                            pRVar18[(long)iVar20 * 0x168 + lVar22].g._h = uVar10;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            pRVar18[(long)iVar20 * 0x168 + lVar22].b._h = uVar10;
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            Imf_2_5::LatLongMap::direction
                                                      ((LatLongMap *)&out,pBVar17,&pos);
                                            Imath_2_5::Vec3<float>::normalized((Vec3<float> *)&r9);
                                            if (1e-05 < (float)(~-(uint)((float)r9.n <
                                                                        filename._M_dataplus._M_p.
                                                                        _0_4_) &
                                                                (uint)((float)r9.n -
                                                                      filename._M_dataplus._M_p.
                                                                      _0_4_) |
                                                               (uint)(filename._M_dataplus._M_p.
                                                                      _0_4_ - (float)r9.n) &
                                                               -(uint)((float)r9.n <
                                                                      filename._M_dataplus._M_p.
                                                                      _0_4_))) {
LAB_00194605:
                                              __assert_fail(
                                                  "dir.equalWithAbsError (dir1.normalized(), 1e-5f)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0xec,
                                                  "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                                  );
                                            }
                                            lVar22 = 1;
                                            do {
                                              lVar23 = lVar22;
                                              if (lVar23 == 3) {
                                                uVar14 = 2;
                                                goto LAB_001917a4;
                                              }
                                              fVar25 = *(float *)((long)&filename._M_dataplus._M_p +
                                                                 lVar23 * 4);
                                              fVar47 = (float)(&r9.n)[lVar23];
                                              lVar22 = lVar23 + 1;
                                            } while ((float)(~-(uint)(fVar47 < fVar25) &
                                                             (uint)(fVar47 - fVar25) |
                                                            (uint)(fVar25 - fVar47) &
                                                            -(uint)(fVar47 < fVar25)) <= 1e-05);
                                            uVar14 = lVar23 - 1;
LAB_001917a4:
                                            if (uVar14 < 2) goto LAB_00194605;
                                            iVar11 = iVar11 + 1;
                                          } while (iVar11 != 0x2f760);
                                          iVar11 = Imf_2_5::globalThreadCount();
                                          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename,(char *)VVar7,
                                                     (Header *)&M1,WRITE_RGB,iVar11);
                                          Imf_2_5::RgbaOutputFile::setFrameBuffer
                                                    ((RgbaOutputFile *)&filename,pRVar18,1,0x168);
                                          Imf_2_5::RgbaOutputFile::writePixels
                                                    ((RgbaOutputFile *)&filename,0xb4);
                                          Imf_2_5::RgbaOutputFile::~RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename);
                                          remove((char *)name_00);
                                          remove((char *)VVar7);
                                          operator_delete__(pRVar18);
                                          Imf_2_5::Header::~Header((Header *)&M1);
                                          if (c.red != (V2f)&c.blue) {
                                            operator_delete((void *)c.red,
                                                            CONCAT44(c.blue.y,c.blue.x) + 1);
                                          }
                                          if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                                            operator_delete((void *)M2.x[0]._0_8_,M2.x[1]._0_8_ + 1)
                                            ;
                                          }
                                          M2.x[0]._0_8_ = M2.x + 1;
                                          pcVar3 = (tempDir->_M_dataplus)._M_p;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&M2,pcVar3,
                                                     pcVar3 + tempDir->_M_string_length);
                                          std::__cxx11::string::append((char *)&M2);
                                          c.red = (V2f)&c.blue;
                                          pcVar3 = (tempDir->_M_dataplus)._M_p;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&c,pcVar3,
                                                     pcVar3 + tempDir->_M_string_length);
                                          std::__cxx11::string::append((char *)&c);
                                          local_360 = (char *)M2.x[0]._0_8_;
                                          local_368 = c.red;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"cube environment map",
                                                     0x14);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          'x');
                                          std::ostream::put('x');
                                          std::ostream::flush();
                                          filename._M_dataplus._M_p = (pointer)0x0;
                                          Imf_2_5::Header::Header
                                                    ((Header *)&M1,0x80,0x300,1.0,(V2f *)&filename,
                                                     1.0,INCREASING_Y,ZIP_COMPRESSION);
                                          filename._M_dataplus._M_p._0_4_ = 1.4013e-45;
                                          Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&filename);
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          iVar11 = Imf_2_5::CubeMap::sizeOfFace(pBVar17);
                                          if (iVar11 != 0x80) {
                                            __assert_fail("sof == N",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x108,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          CVar21 = CUBEFACE_POS_X;
                                          do {
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            Imf_2_5::CubeMap::dataWindowForFace
                                                      ((CubeMap *)&filename,CVar21,pBVar17);
                                            if ((int)(float)filename._M_string_length -
                                                (int)filename._M_dataplus._M_p._0_4_ != 0x7f) {
                                              __assert_fail("dw1.max.x - dw1.min.x == sof - 1",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x10f,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                            }
                                            if (filename._M_string_length._4_4_ -
                                                (int)filename._M_dataplus._M_p._4_4_ != 0x7f) {
                                              __assert_fail("dw1.max.y - dw1.min.y == sof - 1",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x110,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                            }
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            if (((((int)filename._M_dataplus._M_p._0_4_ <
                                                   (pBVar17->min).x) ||
                                                 ((pBVar17->max).x <
                                                  (int)filename._M_dataplus._M_p._0_4_)) ||
                                                ((int)filename._M_dataplus._M_p._4_4_ <
                                                 (pBVar17->min).y)) ||
                                               ((pBVar17->max).y <
                                                (int)filename._M_dataplus._M_p._4_4_)) {
                                              __assert_fail(
                                                  "header.dataWindow().intersects (dw1.min)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x111,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                            }
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            if ((((int)(float)filename._M_string_length <
                                                  (pBVar17->min).x) ||
                                                ((pBVar17->max).x <
                                                 (int)(float)filename._M_string_length)) ||
                                               ((filename._M_string_length._4_4_ < (pBVar17->min).y
                                                || ((pBVar17->max).y <
                                                    filename._M_string_length._4_4_)))) {
                                              __assert_fail(
                                                  "header.dataWindow().intersects (dw1.max)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x112,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                            }
                                            CVar2 = CVar21 + CUBEFACE_NEG_X;
                                            face_00 = CVar2;
                                            if (CVar21 < CUBEFACE_NEG_Z) {
                                              do {
                                                pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1)
                                                ;
                                                Imf_2_5::CubeMap::dataWindowForFace
                                                          ((CubeMap *)&out,face_00,pBVar17);
                                                if ((((int)filename._M_dataplus._M_p._0_4_ <=
                                                      (int)out._outputFile._0_4_) &&
                                                    ((int)out._vptr_RgbaOutputFile._0_4_ <=
                                                     (int)(float)filename._M_string_length)) &&
                                                   (((int)filename._M_dataplus._M_p._4_4_ <=
                                                     out._outputFile._4_4_ &&
                                                    ((int)out._vptr_RgbaOutputFile._4_4_ <=
                                                     filename._M_string_length._4_4_)))) {
                                                  __assert_fail("!dw1.intersects (dw2)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x118,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                                }
                                                face_00 = face_00 + CUBEFACE_NEG_X;
                                              } while (face_00 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                                            }
                                            CVar21 = CVar2;
                                          } while (CVar2 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                                          filename._M_dataplus._M_p = (pointer)0x3f800000;
                                          filename._M_string_length._0_4_ = 0.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_POS_X) {
                                            __assert_fail("face == CUBEFACE_POS_X",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x123,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x124,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          filename._M_dataplus._M_p = (pointer)0xbf800000;
                                          filename._M_string_length._0_4_ = 0.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_NEG_X) {
                                            __assert_fail("face == CUBEFACE_NEG_X",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x12a,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,299,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                                          filename._M_string_length._0_4_ = 0.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_POS_Y) {
                                            __assert_fail("face == CUBEFACE_POS_Y",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x131,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x132,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                                          filename._M_string_length._0_4_ = 0.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_NEG_Y) {
                                            __assert_fail("face == CUBEFACE_NEG_Y",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x138,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x139,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          filename._M_dataplus._M_p = (pointer)0x0;
                                          filename._M_string_length._0_4_ = 1.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_POS_Z) {
                                            __assert_fail("face == CUBEFACE_POS_Z",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x13f,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x140,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          filename._M_dataplus._M_p = (pointer)0x0;
                                          filename._M_string_length._0_4_ = -1.0;
                                          pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                          Imf_2_5::CubeMap::faceAndPixelPosition
                                                    ((V3f *)&filename,pBVar17,&face,&pos);
                                          if (face != CUBEFACE_NEG_Z) {
                                            __assert_fail("face == CUBEFACE_NEG_Z",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x146,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          if ((0.000128 <
                                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5)
                                                      | ~-(uint)(63.5 < pos.x) &
                                                        (uint)(63.5 - pos.x))) ||
                                             (0.000128 <
                                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5)
                                                     | ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)
                                                     ))) {
                                            __assert_fail(
                                                  "pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x147,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                          }
                                          pRVar18 = (Rgba *)operator_new__(0xc0000);
                                          phVar19 = &pRVar18->b;
                                          lVar22 = 0;
                                          do {
                                            lVar23 = 0;
                                            do {
                                              phVar19[lVar23 * 4]._h = 0;
                                              *(undefined4 *)(phVar19 + lVar23 * 4 + -2) = 0;
                                              lVar23 = lVar23 + 1;
                                            } while (lVar23 != 0x80);
                                            lVar22 = lVar22 + 1;
                                            phVar19 = phVar19 + 0x200;
                                          } while (lVar22 != 0x300);
                                          CVar21 = CUBEFACE_POS_X;
                                          do {
                                            fVar25 = 0.0;
                                            do {
                                              local_378[0] = fVar25;
                                              iVar11 = 0;
                                              do {
                                                pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1)
                                                ;
                                                stack0xfffffffffffffc0c = (float)(int)fVar25;
                                                rand._state._0_4_ = (float)iVar11;
                                                Imf_2_5::CubeMap::pixelPosition
                                                          ((CubeMap *)&out,CVar21,pBVar17,
                                                           (V2f *)&rand);
                                                fVar24 = out._vptr_RgbaOutputFile._4_4_;
                                                fVar47 = out._vptr_RgbaOutputFile._0_4_;
                                                pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1)
                                                ;
                                                r9.d = (uint)(float)(int)fVar25;
                                                r9.n = (int)(float)iVar11;
                                                Imf_2_5::CubeMap::direction
                                                          ((CubeMap *)&filename,CVar21,pBVar17,
                                                           (V2f *)&r9);
                                                Imath_2_5::Vec3<float>::normalize
                                                          ((Vec3<float> *)&filename);
                                                fVar26 = filename._M_dataplus._M_p._0_4_ + 1.0;
                                                if ((fVar26 != 0.0) || (NAN(fVar26))) {
                                                  sVar9 = *(short *)((long)&half::_eLut +
                                                                    (ulong)((uint)fVar26 >> 0x17) *
                                                                    2);
                                                  if (sVar9 == 0) {
                                                    uVar10 = half::convert((int)fVar26);
                                                  }
                                                  else {
                                                    uVar10 = sVar9 + (short)(((uint)fVar26 &
                                                                             0x7fffff) + 0xfff +
                                                                             (uint)(((uint)fVar26 >>
                                                                                     0xd & 1) != 0)
                                                                            >> 0xd);
                                                  }
                                                }
                                                else {
                                                  uVar10 = 0;
                                                }
                                                iVar20 = (int)(fVar24 + 0.5);
                                                lVar22 = (long)(int)(fVar47 + 0.5);
                                                pRVar18[(long)iVar20 * 0x80 + lVar22].r._h = uVar10;
                                                fVar47 = filename._M_dataplus._M_p._4_4_ + 1.0;
                                                if ((fVar47 != 0.0) || (NAN(fVar47))) {
                                                  sVar9 = *(short *)((long)&half::_eLut +
                                                                    (ulong)((uint)fVar47 >> 0x17) *
                                                                    2);
                                                  if (sVar9 == 0) {
                                                    uVar10 = half::convert((int)fVar47);
                                                  }
                                                  else {
                                                    uVar10 = sVar9 + (short)(((uint)fVar47 &
                                                                             0x7fffff) + 0xfff +
                                                                             (uint)(((uint)fVar47 >>
                                                                                     0xd & 1) != 0)
                                                                            >> 0xd);
                                                  }
                                                }
                                                else {
                                                  uVar10 = 0;
                                                }
                                                pRVar18[(long)iVar20 * 0x80 + lVar22].g._h = uVar10;
                                                fVar47 = (float)filename._M_string_length + 1.0;
                                                if ((fVar47 != 0.0) || (NAN(fVar47))) {
                                                  sVar9 = *(short *)((long)&half::_eLut +
                                                                    (ulong)((uint)fVar47 >> 0x17) *
                                                                    2);
                                                  if (sVar9 == 0) {
                                                    uVar10 = half::convert((int)fVar47);
                                                  }
                                                  else {
                                                    uVar10 = sVar9 + (short)(((uint)fVar47 &
                                                                             0x7fffff) + 0xfff +
                                                                             (uint)(((uint)fVar47 >>
                                                                                     0xd & 1) != 0)
                                                                            >> 0xd);
                                                  }
                                                }
                                                else {
                                                  uVar10 = 0;
                                                }
                                                pRVar18[(long)iVar20 * 0x80 + lVar22].b._h = uVar10;
                                                iVar11 = iVar11 + 1;
                                              } while (iVar11 != 0x80);
                                              fVar25 = (float)((int)local_378[0] + 1);
                                            } while (fVar25 != 1.79366e-43);
                                            CVar21 = CVar21 + CUBEFACE_NEG_X;
                                          } while (CVar21 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                                          iVar11 = Imf_2_5::globalThreadCount();
                                          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename,local_360,
                                                     (Header *)&M1,WRITE_RGB,iVar11);
                                          Imf_2_5::RgbaOutputFile::setFrameBuffer
                                                    ((RgbaOutputFile *)&filename,pRVar18,1,0x80);
                                          Imf_2_5::RgbaOutputFile::writePixels
                                                    ((RgbaOutputFile *)&filename,0x300);
                                          Imf_2_5::RgbaOutputFile::~RgbaOutputFile
                                                    ((RgbaOutputFile *)&filename);
                                          phVar19 = &pRVar18->b;
                                          lVar22 = 0;
                                          do {
                                            lVar23 = 0;
                                            do {
                                              if ((((*(float *)((long)&half::_toFloat +
                                                               (ulong)phVar19[lVar23 * 4 + -2]._h *
                                                               4) == 0.0) &&
                                                   (fVar25 = *(float *)((long)&half::_toFloat +
                                                                       (ulong)phVar19[lVar23 * 4 +
                                                                                      -1]._h * 4),
                                                   fVar25 == 0.0)) && (!NAN(fVar25))) &&
                                                 ((fVar25 = *(float *)((long)&half::_toFloat +
                                                                      (ulong)phVar19[lVar23 * 4]._h
                                                                      * 4), fVar25 == 0.0 &&
                                                  (!NAN(fVar25))))) {
                                                __assert_fail("p.r != 0 || p.g != 0 || p.b != 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x177,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                              }
                                              lVar23 = lVar23 + 1;
                                            } while (lVar23 != 0x80);
                                            lVar22 = lVar22 + 1;
                                            phVar19 = phVar19 + 0x200;
                                          } while (lVar22 != 0x300);
                                          _rand_1 = CONCAT26(uStack_44a,0x5a5a5a5a5a5a);
                                          iVar11 = 0;
                                          while( true ) {
                                            Imath_2_5::
                                            hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                                      ((Imath_2_5 *)&filename,&rand_1);
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            Imf_2_5::CubeMap::faceAndPixelPosition
                                                      ((V3f *)&filename,pBVar17,&face_2,&pif);
                                            CVar21 = face_2;
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            local_3b8.x = pif.x;
                                            local_3b8.y = pif.y;
                                            Imf_2_5::CubeMap::pixelPosition
                                                      ((CubeMap *)&pos_2,CVar21,pBVar17,
                                                       (V2f *)&local_3b8);
                                            fVar24 = pos_2.y;
                                            fVar47 = pos_2.x;
                                            fVar25 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            iVar20 = (int)(fVar24 + 0.5);
                                            lVar22 = (long)(int)(fVar47 + 0.5);
                                            fVar25 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                                            pRVar18[(long)iVar20 * 0x80 + lVar22].r._h = uVar10;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            fVar25 = ((float)filename._M_string_length + 1.0) * 0.8;
                                            pRVar18[(long)iVar20 * 0x80 + lVar22].g._h = uVar10;
                                            if ((fVar25 != 0.0) || (NAN(fVar25))) {
                                              sVar9 = *(short *)((long)&half::_eLut +
                                                                (ulong)((uint)fVar25 >> 0x17) * 2);
                                              if (sVar9 == 0) {
                                                uVar10 = half::convert((int)fVar25);
                                              }
                                              else {
                                                uVar10 = sVar9 + (short)(((uint)fVar25 & 0x7fffff) +
                                                                         0xfff + (uint)(((uint)
                                                  fVar25 >> 0xd & 1) != 0) >> 0xd);
                                              }
                                            }
                                            else {
                                              uVar10 = (unsigned_short)((uint)fVar25 >> 0x10);
                                            }
                                            pRVar18[(long)iVar20 * 0x80 + lVar22].b._h = uVar10;
                                            CVar21 = face_2;
                                            pBVar17 = Imf_2_5::Header::dataWindow((Header *)&M1);
                                            Imf_2_5::CubeMap::direction
                                                      ((CubeMap *)&out,CVar21,pBVar17,&pif);
                                            Imath_2_5::Vec3<float>::normalized((Vec3<float> *)&r9);
                                            if (1e-06 < (float)(~-(uint)((float)r9.n <
                                                                        filename._M_dataplus._M_p.
                                                                        _0_4_) &
                                                                (uint)((float)r9.n -
                                                                      filename._M_dataplus._M_p.
                                                                      _0_4_) |
                                                               (uint)(filename._M_dataplus._M_p.
                                                                      _0_4_ - (float)r9.n) &
                                                               -(uint)((float)r9.n <
                                                                      filename._M_dataplus._M_p.
                                                                      _0_4_))) break;
                                            lVar22 = 1;
                                            do {
                                              lVar23 = lVar22;
                                              if (lVar23 == 3) {
                                                uVar14 = 2;
                                                goto LAB_001925ed;
                                              }
                                              fVar25 = *(float *)((long)&filename._M_dataplus._M_p +
                                                                 lVar23 * 4);
                                              fVar47 = (float)(&r9.n)[lVar23];
                                              lVar22 = lVar23 + 1;
                                            } while ((float)(~-(uint)(fVar47 < fVar25) &
                                                             (uint)(fVar47 - fVar25) |
                                                            (uint)(fVar25 - fVar47) &
                                                            -(uint)(fVar47 < fVar25)) <= 1e-06);
                                            uVar14 = lVar23 - 1;
LAB_001925ed:
                                            if (uVar14 < 2) break;
                                            iVar11 = iVar11 + 1;
                                            if (iVar11 == 0x48000) {
                                              iVar11 = Imf_2_5::globalThreadCount();
                                              Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                                        ((RgbaOutputFile *)&filename,
                                                         (char *)local_368,(Header *)&M1,WRITE_RGB,
                                                         iVar11);
                                              Imf_2_5::RgbaOutputFile::setFrameBuffer
                                                        ((RgbaOutputFile *)&filename,pRVar18,1,0x80)
                                              ;
                                              Imf_2_5::RgbaOutputFile::writePixels
                                                        ((RgbaOutputFile *)&filename,0x300);
                                              Imf_2_5::RgbaOutputFile::~RgbaOutputFile
                                                        ((RgbaOutputFile *)&filename);
                                              remove(local_360);
                                              remove((char *)local_368);
                                              operator_delete__(pRVar18);
                                              Imf_2_5::Header::~Header((Header *)&M1);
                                              if (c.red != (V2f)&c.blue) {
                                                operator_delete((void *)c.red,
                                                                CONCAT44(c.blue.y,c.blue.x) + 1);
                                              }
                                              if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                                                operator_delete((void *)M2.x[0]._0_8_,
                                                                M2.x[1]._0_8_ + 1);
                                              }
                                              c.red = (V2f)&c.blue;
                                              pcVar3 = (tempDir->_M_dataplus)._M_p;
                                              std::__cxx11::string::_M_construct<char*>
                                                        ((string *)&c,pcVar3,
                                                         pcVar3 + tempDir->_M_string_length);
                                              std::__cxx11::string::append((char *)&c);
                                              VVar7 = c.red;
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"key code attribute",
                                                         0x12);
                                              std::ios::widen((char)*(undefined8 *)
                                                                     (std::cout + -0x18) + 'x');
                                              std::ostream::put('x');
                                              std::ostream::flush();
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"writing, ",9);
                                              Imf_2_5::KeyCode::KeyCode
                                                        ((KeyCode *)&filename,0xc,0x22,0x1e240,0x4d2
                                                         ,0x2d,3,0x50);
                                              iVar11 = Imf_2_5::KeyCode::filmMfcCode
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 0xc) {
                                                __assert_fail("k1.filmMfcCode() == 12",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1ac,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::filmType
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 0x22) {
                                                __assert_fail("k1.filmType() == 34",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1ad,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::prefix
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 0x1e240) {
                                                __assert_fail("k1.prefix() == 123456",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1ae,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::count((KeyCode *)&filename)
                                              ;
                                              if (iVar11 != 0x4d2) {
                                                __assert_fail("k1.count() == 1234",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1af,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfOffset
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 0x2d) {
                                                __assert_fail("k1.perfOffset() == 45",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1b0,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfsPerFrame
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 3) {
                                                __assert_fail("k1.perfsPerFrame() == 3",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1b1,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfsPerCount
                                                                 ((KeyCode *)&filename);
                                              if (iVar11 != 0x50) {
                                                __assert_fail("k1.perfsPerCount() == 80",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1b2,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              M1.x[0][0] = 0.0;
                                              M1.x[0][1] = 0.0;
                                              Imf_2_5::Header::Header
                                                        ((Header *)&M2,100,100,1.0,(V2f *)&M1,1.0,
                                                         INCREASING_Y,ZIP_COMPRESSION);
                                              bVar8 = Imf_2_5::hasKeyCode((Header *)&M2);
                                              if (bVar8) {
                                                __assert_fail("hasKeyCode (header) == false",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1b8,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              Imf_2_5::addKeyCode((Header *)&M2,(KeyCode *)&filename
                                                                 );
                                              bVar8 = Imf_2_5::hasKeyCode((Header *)&M2);
                                              if (!bVar8) {
                                                __assert_fail("hasKeyCode (header) == true",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1bb,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::globalThreadCount();
                                              Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                                        (&out,(char *)VVar7,(Header *)&M2,WRITE_RGBA
                                                         ,iVar11);
                                              lVar22 = 0;
                                              do {
                                                sVar9 = sVar6;
                                                if (sVar6 == 0) {
                                                  sVar9 = half::convert(0x3f800000);
                                                }
                                                *(short *)(M1.x[0] + lVar22 * 2) = sVar9;
                                                sVar9 = sVar6;
                                                if (sVar6 == 0) {
                                                  sVar9 = half::convert(0x3f800000);
                                                }
                                                *(short *)((long)M1.x[0] + lVar22 * 8 + 2) = sVar9;
                                                sVar9 = sVar6;
                                                if (sVar6 == 0) {
                                                  sVar9 = half::convert(0x3f800000);
                                                }
                                                *(short *)(M1.x[0] + lVar22 * 2 + 1) = sVar9;
                                                sVar9 = sVar6;
                                                if (sVar6 == 0) {
                                                  sVar9 = half::convert(0x3f800000);
                                                }
                                                *(short *)((long)M1.x[0] + lVar22 * 8 + 6) = sVar9;
                                                lVar22 = lVar22 + 1;
                                              } while (lVar22 != 100);
                                              Imf_2_5::RgbaOutputFile::setFrameBuffer
                                                        (&out,(Rgba *)&M1,1,0);
                                              Imf_2_5::RgbaOutputFile::writePixels(&out,100);
                                              Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"reading, comparing",
                                                         0x12);
                                              std::ios::widen((char)*(undefined8 *)
                                                                     (std::cout + -0x18) + 'x');
                                              std::ostream::put('x');
                                              std::ostream::flush();
                                              iVar11 = Imf_2_5::globalThreadCount();
                                              Imf_2_5::RgbaInputFile::RgbaInputFile
                                                        ((RgbaInputFile *)&M1,(char *)VVar7,iVar11);
                                              pHVar15 = Imf_2_5::RgbaInputFile::header
                                                                  ((RgbaInputFile *)&M1);
                                              this = Imf_2_5::keyCode(pHVar15);
                                              pHVar15 = Imf_2_5::RgbaInputFile::header
                                                                  ((RgbaInputFile *)&M1);
                                              bVar8 = Imf_2_5::hasKeyCode(pHVar15);
                                              if (!bVar8) {
                                                __assert_fail("hasKeyCode (in.header()) == true",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d3,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::filmMfcCode
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::filmMfcCode(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail("k1.filmMfcCode() == k2.filmMfcCode()"
                                                              ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d4,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::filmType
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::filmType(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail("k1.filmType() == k2.filmType()",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d5,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::prefix
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::prefix(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail("k1.prefix() == k2.prefix()",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d6,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::count((KeyCode *)&filename)
                                              ;
                                              iVar20 = Imf_2_5::KeyCode::count(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail("k1.count() == k2.count()",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d7,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfOffset
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::perfOffset(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail("k1.perfOffset() == k2.perfOffset()",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d8,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfsPerFrame
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::perfsPerFrame(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail(
                                                  "k1.perfsPerFrame() == k2.perfsPerFrame()",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1d9,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              iVar11 = Imf_2_5::KeyCode::perfsPerCount
                                                                 ((KeyCode *)&filename);
                                              iVar20 = Imf_2_5::KeyCode::perfsPerCount(this);
                                              if (iVar11 != iVar20) {
                                                __assert_fail(
                                                  "k1.perfsPerCount() == k2.perfsPerCount()",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1da,
                                                  "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                                  );
                                              }
                                              Imf_2_5::RgbaInputFile::~RgbaInputFile
                                                        ((RgbaInputFile *)&M1);
                                              remove((char *)VVar7);
                                              Imf_2_5::Header::~Header((Header *)&M2);
                                              if (c.red != (V2f)&c.blue) {
                                                operator_delete((void *)c.red,
                                                                CONCAT44(c.blue.y,c.blue.x) + 1);
                                              }
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"time code methods",
                                                         0x11);
                                              std::ios::widen((char)*(undefined8 *)
                                                                     (std::cout + -0x18) + 'x');
                                              std::ostream::put('x');
                                              std::ostream::flush();
                                              Imf_2_5::TimeCode::TimeCode((TimeCode *)&M1);
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0) {
                                                __assert_fail("t.timeAndFlags() == 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1e8,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::userData((TimeCode *)&M1);
                                              if (uVar12 != 0) {
                                                __assert_fail("t.userData() == 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1e9,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0,TV60_PACKING);
                                              Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0x1d);
                                              iVar11 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                                              if (iVar11 != 0x1d) {
                                                __assert_fail("t.frame() == 29",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1ef,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0x29) {
                                                __assert_fail("t.timeAndFlags() == 0x00000029",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1f0,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                                              Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0);
                                              iVar11 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                                              if (iVar11 != 0) {
                                                __assert_fail("t.frame() == 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,500,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0xffffffc0) {
                                                __assert_fail("t.timeAndFlags() == 0xffffffc0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1f5,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0,TV60_PACKING);
                                              Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0x3b);
                                              iVar11 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                                              if (iVar11 != 0x3b) {
                                                __assert_fail("t.seconds() == 59",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1fb,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0x5900) {
                                                __assert_fail("t.timeAndFlags() == 0x00005900",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x1fc,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                                              Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0);
                                              iVar11 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                                              if (iVar11 != 0) {
                                                __assert_fail("t.seconds() == 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x200,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0xffff80ff) {
                                                __assert_fail("t.timeAndFlags() == 0xffff80ff",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x201,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0,TV60_PACKING);
                                              Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0x3b);
                                              iVar11 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                                              if (iVar11 != 0x3b) {
                                                __assert_fail("t.minutes() == 59",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x207,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0x590000) {
                                                __assert_fail("t.timeAndFlags() == 0x00590000",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x208,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                                              Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0);
                                              iVar11 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                                              if (iVar11 != 0) {
                                                __assert_fail("t.minutes() == 0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x20c,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                 ((TimeCode *)&M1,TV60_PACKING);
                                              if (uVar12 != 0xff80ffff) {
                                                __assert_fail("t.timeAndFlags() == 0xff80ffff",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x20d,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              Imf_2_5::TimeCode::setTimeAndFlags
                                                        ((TimeCode *)&M1,0,TV60_PACKING);
                                              Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0x17);
                                              iVar11 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                                              if (iVar11 == 0x17) {
                                                uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                   ((TimeCode *)&M1,TV60_PACKING);
                                                if (uVar12 != 0x23000000) {
                                                  __assert_fail("t.timeAndFlags() == 0x23000000",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x214,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                Imf_2_5::TimeCode::setTimeAndFlags
                                                          ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                                                Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0);
                                                iVar11 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                                                if (iVar11 != 0) {
                                                  __assert_fail("t.hours() == 0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x218,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                   ((TimeCode *)&M1,TV60_PACKING);
                                                if (uVar12 != 0xc0ffffff) {
                                                  __assert_fail("t.timeAndFlags() == 0xc0ffffff",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x219,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                Imf_2_5::TimeCode::setTimeAndFlags
                                                          ((TimeCode *)&M1,0,TV60_PACKING);
                                                Imf_2_5::TimeCode::setDropFrame
                                                          ((TimeCode *)&M1,true);
                                                bVar8 = Imf_2_5::TimeCode::dropFrame
                                                                  ((TimeCode *)&M1);
                                                if (!bVar8) {
                                                  __assert_fail("t.dropFrame() == true",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x21f,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                   ((TimeCode *)&M1,TV60_PACKING);
                                                if (uVar12 != 0x40) {
                                                  __assert_fail("t.timeAndFlags() == 0x00000040",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x220,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                Imf_2_5::TimeCode::setTimeAndFlags
                                                          ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                                                Imf_2_5::TimeCode::setDropFrame
                                                          ((TimeCode *)&M1,false);
                                                bVar8 = Imf_2_5::TimeCode::dropFrame
                                                                  ((TimeCode *)&M1);
                                                if (bVar8) {
                                                  __assert_fail("t.dropFrame() == false",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x224,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                   ((TimeCode *)&M1,TV60_PACKING);
                                                if (uVar12 != 0xffffffbf) {
                                                  __assert_fail("t.timeAndFlags() == 0xffffffbf",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x225,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                Imf_2_5::TimeCode::setTimeAndFlags
                                                          ((TimeCode *)&M1,0,TV60_PACKING);
                                                Imf_2_5::TimeCode::setColorFrame
                                                          ((TimeCode *)&M1,true);
                                                bVar8 = Imf_2_5::TimeCode::colorFrame
                                                                  ((TimeCode *)&M1);
                                                if (bVar8) {
                                                  uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                     ((TimeCode *)&M1,TV60_PACKING);
                                                  if (uVar12 != 0x80) {
                                                    __assert_fail("t.timeAndFlags() == 0x00000080",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x22c,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                  }
                                                  Imf_2_5::TimeCode::setTimeAndFlags
                                                            ((TimeCode *)&M1,0xffffffff,TV60_PACKING
                                                            );
                                                  Imf_2_5::TimeCode::setColorFrame
                                                            ((TimeCode *)&M1,false);
                                                  bVar8 = Imf_2_5::TimeCode::colorFrame
                                                                    ((TimeCode *)&M1);
                                                  if (bVar8) {
                                                    __assert_fail("t.colorFrame() == false",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x230,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                  }
                                                  uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                     ((TimeCode *)&M1,TV60_PACKING);
                                                  if (uVar12 != 0xffffff7f) {
                                                    __assert_fail("t.timeAndFlags() == 0xffffff7f",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x231,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                  }
                                                  Imf_2_5::TimeCode::setTimeAndFlags
                                                            ((TimeCode *)&M1,0,TV60_PACKING);
                                                  Imf_2_5::TimeCode::setFieldPhase
                                                            ((TimeCode *)&M1,true);
                                                  bVar8 = Imf_2_5::TimeCode::fieldPhase
                                                                    ((TimeCode *)&M1);
                                                  if (bVar8) {
                                                    uVar12 = Imf_2_5::TimeCode::timeAndFlags
                                                                       ((TimeCode *)&M1,TV60_PACKING
                                                                       );
                                                    if (uVar12 == 0x8000) {
                                                      Imf_2_5::TimeCode::timeAndFlags
                                                                ((TimeCode *)&M1,TV50_PACKING);
                                                      __assert_fail(
                                                  "t.timeAndFlags (TimeCode::TV50_PACKING) == 0x80000000"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x239,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                  }
                                                  __assert_fail(
                                                  "t.timeAndFlags (TimeCode::TV60_PACKING) == 0x00008000"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x238,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                  }
                                                  __assert_fail("t.fieldPhase() == true",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x237,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                                }
                                                __assert_fail("t.colorFrame() == true",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x22b,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                              }
                                              __assert_fail("t.hours() == 23",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0x213,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                            }
                                          }
                                          __assert_fail(
                                                  "dir.equalWithAbsError (dir1.normalized(), 1e-6f)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,399,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                        }
                                      }
                                      __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f * W)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                  ,0xc4,
                                                  "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                                  );
                                    }
                                  }
                                  __assert_fail("pos.equalWithAbsError (V2f (-M_PI/4, 0), 1e-6f)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                                ,0xc1,
                                                "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                               );
                                }
                              }
                              __assert_fail("pos.equalWithAbsError (V2f (M_PI/4, 0), 1e-6f)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                            ,0xbe,
                                            "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                           );
                            }
                          }
                          __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xb5,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                      }
                      __assert_fail("c1.red == c2.red",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                    ,0x98,
                                    "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                   );
                    }
                  }
                  __assert_fail("W2.equalWithAbsError (V3f (1, 1, 1), 1e-3F)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                ,0x6c,"void (anonymous namespace)::convertRGBtoXYZ()");
                }
              }
              __assert_fail("B2.equalWithAbsError (V3f (0, 0, 1), 1e-3F)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                            ,0x6b,"void (anonymous namespace)::convertRGBtoXYZ()");
            }
          }
          __assert_fail("G2.equalWithAbsError (V3f (0, 1, 0), 1e-3F)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                        ,0x6a,"void (anonymous namespace)::convertRGBtoXYZ()");
        }
      }
      __assert_fail("R2.equalWithAbsError (V3f (1, 0, 0), 1e-3F)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                    ,0x69,"void (anonymous namespace)::convertRGBtoXYZ()");
    }
  }
  __assert_fail("r1.equalWithAbsError (c.red, 1e-5F)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                ,0x56,"void (anonymous namespace)::convertRGBtoXYZ()");
}

Assistant:

void
testStandardAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing optional standard attributes" << endl;

	convertRGBtoXYZ();

	{
	    std::string filename = tempDir + "imf_test_chromaticities.exr";
	    writeReadChromaticities (filename.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_latlong1.exr";
	    std::string fn2 = tempDir + "imf_test_latlong2.exr";
	    latLongMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_cube1.exr";
	    std::string fn2 = tempDir + "imf_test_cube2.exr";
	    cubeMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string filename = tempDir + "imf_test_keycode.exr";
	    writeReadKeyCode (filename.c_str());
	}

	{
	    timeCodeMethods();
	    std::string filename = tempDir + "imf_test_timecode.exr";
	    writeReadTimeCode (filename.c_str());
	}

	{
	    rationalMethods();
	    std::string filename = tempDir + "imf_test_rational.exr";
	    writeReadRational (filename.c_str());
	}

	generatedFunctions();

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}